

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_state.cpp
# Opt level: O3

bit_cost_t __thiscall
lzham::lzcompressor::state::get_lit_cost
          (state *this,CLZBase *lzbase,search_accelerator *dict,uint dict_pos,uint lit_pred0,
          uint is_match_model_index)

{
  uchar *puVar1;
  byte bVar2;
  long lVar3;
  
  puVar1 = (dict->m_dict).m_p;
  bVar2 = puVar1[dict_pos];
  lVar3 = 0x108;
  if (6 < (this->super_state_base).m_cur_state) {
    bVar2 = bVar2 ^ puVar1[dict_pos - (this->super_state_base).m_match_hist[0] &
                           dict->m_max_dict_size_mask];
    lVar3 = 0x198;
  }
  return (ulong)*(byte *)(*(long *)((long)(this->super_state_base).m_match_hist + lVar3 + -8) +
                         (ulong)bVar2) * 0x1000000 +
         (ulong)*(uint *)((long)&g_prob_cost +
                         (ulong)this->m_is_match_model[is_match_model_index].m_bit_0_prob * 4);
}

Assistant:

bit_cost_t lzcompressor::state::get_lit_cost(CLZBase& lzbase, const search_accelerator& dict, uint dict_pos, uint lit_pred0, uint is_match_model_index) const
   {
		LZHAM_NOTE_UNUSED(lzbase);
		LZHAM_NOTE_UNUSED(lit_pred0);

      bit_cost_t cost = m_is_match_model[is_match_model_index].get_cost(0);

      const uint lit = dict[dict_pos];

      if (m_cur_state < CLZBase::cNumLitStates)
      {
         // literal
         cost += m_lit_table.get_cost(lit);
      }
      else
      {
         // delta literal
         const uint rep_lit0 = dict[(dict_pos - m_match_hist[0]) & dict.m_max_dict_size_mask];
         
         uint delta_lit = rep_lit0 ^ lit;

         cost += m_delta_lit_table.get_cost(delta_lit);
      }

      return cost;
   }